

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,int *activateScaling)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int expTmp;
  int j;
  double sum2;
  double sum1;
  int i;
  int w;
  int k;
  int v;
  int u;
  int l;
  int local_60;
  int local_5c;
  double local_58;
  double local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x34); local_34 = local_34 + 1) {
    local_38 = local_34 * *(int *)(in_RDI + 0x2c) * *(int *)(in_RDI + 0x14);
    local_3c = local_34 * *(int *)(in_RDI + 0x2c) * *(int *)(in_RDI + 0x14);
    for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x14); local_40 = local_40 + 1) {
      local_44 = local_34 * *(int *)(in_RDI + 0x40);
      for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x24); local_48 = local_48 + 1) {
        local_50 = 0.0;
        local_58 = 0.0;
        for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x24); local_5c = local_5c + 1) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(local_20 + (long)local_44 * 8);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(local_18 + (long)(local_3c + local_5c) * 8);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_50;
          auVar2 = vfmadd213sd_fma(auVar2,auVar4,auVar6);
          local_50 = auVar2._0_8_;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(local_30 + (long)local_44 * 8);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(local_28 + (long)(local_3c + local_5c) * 8);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_58;
          auVar2 = vfmadd213sd_fma(auVar3,auVar5,auVar7);
          local_58 = auVar2._0_8_;
          local_44 = local_44 + 1;
        }
        local_44 = local_44 + 1;
        *(double *)(local_10 + (long)local_38 * 8) = local_50 * local_58;
        if (*_expTmp == 0) {
          frexp(*(double *)(local_10 + (long)local_38 * 8),&local_60);
          iVar1 = local_60;
          if (local_60 < 1) {
            iVar1 = -local_60;
          }
          if (*(int *)(in_RDI + 0x68) < iVar1) {
            *_expTmp = 1;
          }
        }
        local_38 = local_38 + 1;
      }
      local_3c = *(int *)(in_RDI + 0x2c) + local_3c;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                               const REALTYPE* partials1,
                                                               const REALTYPE* matrices1,
                                                               const REALTYPE* partials2,
                                                               const REALTYPE* matrices2,
                                                               int* activateScaling) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*kPartialsPaddedStateCount*kPatternCount;
        int v = l*kPartialsPaddedStateCount*kPatternCount;
        for (int k = 0; k < kPatternCount; k++) {
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount; i++) {
                REALTYPE sum1 = 0.0, sum2 = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sum1 += matrices1[w] * partials1[v + j];
                    sum2 += matrices2[w] * partials2[v + j];
                    w++;
                }

                // increment for the extra column at the end
                w += T_PAD;

                destP[u] = sum1 * sum2;

                if (*activateScaling == 0) {
                    int expTmp;
                    frexp(destP[u], &expTmp);
                    if (abs(expTmp) > scalingExponentThreshold)
                        *activateScaling = 1;
                }

                u++;
            }
            u += P_PAD;
            v += kPartialsPaddedStateCount;
        }
    }
}